

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_get_tile(opj_j2k_v2_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                     opj_event_mgr *p_manager,OPJ_UINT32 tile_index)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  OPJ_COLOR_SPACE OVar3;
  int iVar4;
  opj_bool oVar5;
  opj_image_t *poVar6;
  opj_event_mgr_t *in_RCX;
  uint uVar7;
  uint *in_RDX;
  long in_RDI;
  uint in_R8D;
  OPJ_INT32 l_comp_y1;
  OPJ_INT32 l_comp_x1;
  opj_image_comp_t *l_img_comp;
  OPJ_UINT32 l_tile_y;
  OPJ_UINT32 l_tile_x;
  OPJ_UINT32 compno;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  opj_stream_private_t *p_stream_00;
  uint uVar8;
  opj_bool local_4;
  
  if (in_RDX == (uint *)0x0) {
    opj_event_msg_v2(in_RCX,1,"We need an image previously created.\n");
    local_4 = 0;
  }
  else {
    uVar7 = in_R8D % *(uint *)(in_RDI + 0x90);
    uVar1 = in_R8D / *(uint *)(in_RDI + 0x90);
    *in_RDX = uVar7 * *(int *)(in_RDI + 0x7c) + *(int *)(in_RDI + 0x74);
    if (*in_RDX < **(uint **)(in_RDI + 0x60)) {
      *in_RDX = **(uint **)(in_RDI + 0x60);
    }
    in_RDX[2] = (uVar7 + 1) * *(int *)(in_RDI + 0x7c) + *(int *)(in_RDI + 0x74);
    if (*(uint *)(*(long *)(in_RDI + 0x60) + 8) < in_RDX[2]) {
      in_RDX[2] = *(uint *)(*(long *)(in_RDI + 0x60) + 8);
    }
    in_RDX[1] = uVar1 * *(int *)(in_RDI + 0x80) + *(int *)(in_RDI + 0x78);
    if (in_RDX[1] < *(uint *)(*(long *)(in_RDI + 0x60) + 4)) {
      in_RDX[1] = *(uint *)(*(long *)(in_RDI + 0x60) + 4);
    }
    in_RDX[3] = (uVar1 + 1) * *(int *)(in_RDI + 0x80) + *(int *)(in_RDI + 0x78);
    if (*(uint *)(*(long *)(in_RDI + 0x60) + 0xc) < in_RDX[3]) {
      in_RDX[3] = *(uint *)(*(long *)(in_RDI + 0x60) + 0xc);
    }
    p_stream_00 = *(opj_stream_private_t **)(in_RDX + 6);
    for (uVar8 = 0; uVar8 < in_RDX[4]; uVar8 = uVar8 + 1) {
      *(OPJ_INT32 *)&p_stream_00->m_seek_fn =
           *(OPJ_INT32 *)(*(long *)(*(long *)(in_RDI + 0x60) + 0x18) + (ulong)uVar8 * 0x38 + 0x28);
      OVar2 = int_ceildiv(*in_RDX,*(OPJ_UINT32 *)&p_stream_00->m_user_data);
      *(OPJ_UINT32 *)&p_stream_00->m_read_fn = OVar2;
      OVar3 = int_ceildiv(in_RDX[1],*(OPJ_UINT32 *)((long)&p_stream_00->m_user_data + 4));
      *(OPJ_COLOR_SPACE *)((long)&p_stream_00->m_read_fn + 4) = OVar3;
      in_stack_ffffffffffffffbc = int_ceildiv(in_RDX[2],*(OPJ_UINT32 *)&p_stream_00->m_user_data);
      in_stack_ffffffffffffffb8 =
           int_ceildiv(in_RDX[3],*(OPJ_UINT32 *)((long)&p_stream_00->m_user_data + 4));
      in_stack_ffffffffffffffb0 =
           int_ceildivpow2(in_stack_ffffffffffffffbc,*(int *)&p_stream_00->m_seek_fn);
      iVar4 = int_ceildivpow2(*(OPJ_UINT32 *)&p_stream_00->m_read_fn,*(int *)&p_stream_00->m_seek_fn
                             );
      *(int *)&p_stream_00->m_user_data_length = in_stack_ffffffffffffffb0 - iVar4;
      in_stack_ffffffffffffffb4 =
           int_ceildivpow2(in_stack_ffffffffffffffb8,*(int *)&p_stream_00->m_seek_fn);
      iVar4 = int_ceildivpow2(*(OPJ_COLOR_SPACE *)((long)&p_stream_00->m_read_fn + 4),
                              *(int *)&p_stream_00->m_seek_fn);
      *(int *)((long)&p_stream_00->m_user_data_length + 4) = in_stack_ffffffffffffffb4 - iVar4;
      p_stream_00 = (opj_stream_private_t *)&p_stream_00->m_current_data;
    }
    if (*(long *)(in_RDI + 0x68) != 0) {
      opj_image_destroy((opj_image_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                       );
    }
    poVar6 = opj_image_create0();
    *(opj_image_t **)(in_RDI + 0x68) = poVar6;
    if (*(long *)(in_RDI + 0x68) == 0) {
      local_4 = 0;
    }
    else {
      opj_copy_image_header
                ((opj_image_t *)p_stream_00,
                 (opj_image_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      *(uint *)(in_RDI + 0x48) = in_R8D;
      j2k_setup_decoding_tile((opj_j2k_v2_t *)0x2b8856);
      oVar5 = j2k_exec((opj_j2k_v2_t *)CONCAT44(in_R8D,uVar8),
                       (opj_procedure_list_t *)CONCAT44(uVar7,uVar1),p_stream_00,
                       (opj_event_mgr_t *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (oVar5 == 0) {
        opj_image_destroy((opj_image_t *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        *(undefined8 *)(in_RDI + 0x60) = 0;
        local_4 = 0;
      }
      else {
        for (uVar1 = 0; uVar1 < in_RDX[4]; uVar1 = uVar1 + 1) {
          *(undefined4 *)(*(long *)(in_RDX + 6) + (ulong)uVar1 * 0x38 + 0x24) =
               *(undefined4 *)
                (*(long *)(*(long *)(in_RDI + 0x68) + 0x18) + (ulong)uVar1 * 0x38 + 0x24);
          if (*(long *)(*(long *)(in_RDX + 6) + (ulong)uVar1 * 0x38 + 0x30) != 0) {
            free(*(void **)(*(long *)(in_RDX + 6) + (ulong)uVar1 * 0x38 + 0x30));
          }
          *(undefined8 *)(*(long *)(in_RDX + 6) + (ulong)uVar1 * 0x38 + 0x30) =
               *(undefined8 *)
                (*(long *)(*(long *)(in_RDI + 0x68) + 0x18) + (ulong)uVar1 * 0x38 + 0x30);
          *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x18) + (ulong)uVar1 * 0x38 + 0x30) =
               0;
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_get_tile(	opj_j2k_v2_t *p_j2k,
						opj_stream_private_t *p_stream,
						opj_image_t* p_image,
						struct opj_event_mgr * p_manager,
						OPJ_UINT32 tile_index )
{
	OPJ_UINT32 compno;
	OPJ_UINT32 l_tile_x, l_tile_y;
	opj_image_comp_t* l_img_comp;

	if (!p_image) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "We need an image previously created.\n");
		return OPJ_FALSE;
	}

	if ( (tile_index < 0) && (tile_index >= p_j2k->m_cp.tw * p_j2k->m_cp.th) ){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Tile index provided by the user is incorrect %d (max = %d) \n", tile_index, (p_j2k->m_cp.tw * p_j2k->m_cp.th) - 1);
		return OPJ_FALSE;
	}

	/* Compute the dimension of the desired tile*/
	l_tile_x = tile_index % p_j2k->m_cp.tw;
	l_tile_y = tile_index / p_j2k->m_cp.tw;

	p_image->x0 = l_tile_x * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
	if (p_image->x0 < p_j2k->m_private_image->x0)
		p_image->x0 = p_j2k->m_private_image->x0;
	p_image->x1 = (l_tile_x + 1) * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
	if (p_image->x1 > p_j2k->m_private_image->x1)
		p_image->x1 = p_j2k->m_private_image->x1;

	p_image->y0 = l_tile_y * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
	if (p_image->y0 < p_j2k->m_private_image->y0)
		p_image->y0 = p_j2k->m_private_image->y0;
	p_image->y1 = (l_tile_y + 1) * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
	if (p_image->y1 > p_j2k->m_private_image->y1)
		p_image->y1 = p_j2k->m_private_image->y1;

	l_img_comp = p_image->comps;
	for (compno=0; compno < p_image->numcomps; ++compno)
	{
		OPJ_INT32 l_comp_x1, l_comp_y1;

		l_img_comp->factor = p_j2k->m_private_image->comps[compno].factor;

		l_img_comp->x0 = int_ceildiv(p_image->x0, l_img_comp->dx);
		l_img_comp->y0 = int_ceildiv(p_image->y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(p_image->x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(p_image->y1, l_img_comp->dy);

		l_img_comp->w = int_ceildivpow2(l_comp_x1, l_img_comp->factor) - int_ceildivpow2(l_img_comp->x0, l_img_comp->factor);
		l_img_comp->h = int_ceildivpow2(l_comp_y1, l_img_comp->factor) - int_ceildivpow2(l_img_comp->y0, l_img_comp->factor);

		l_img_comp++;
	}

	/* Destroy the previous output image*/
	if (p_j2k->m_output_image)
		opj_image_destroy(p_j2k->m_output_image);

	/* Create the ouput image from the information previously computed*/
	p_j2k->m_output_image = opj_image_create0();
	if (! (p_j2k->m_output_image)) {
		return OPJ_FALSE;
	}
	opj_copy_image_header(p_image, p_j2k->m_output_image);

	p_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec = tile_index;

	/* customization of the decoding */
	j2k_setup_decoding_tile(p_j2k);

	/* Decode the codestream */
	if (! j2k_exec (p_j2k,p_j2k->m_procedure_list,p_stream,p_manager)) {
		opj_image_destroy(p_j2k->m_private_image);
		p_j2k->m_private_image = NULL;
		return OPJ_FALSE;
	}

	/* Move data and copy one information from codec to output image*/
	for (compno = 0; compno < p_image->numcomps; compno++) {
		p_image->comps[compno].resno_decoded = p_j2k->m_output_image->comps[compno].resno_decoded;

		if (p_image->comps[compno].data)
			opj_free(p_image->comps[compno].data);

		p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;

		p_j2k->m_output_image->comps[compno].data = NULL;
	}

	return OPJ_TRUE;
}